

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

ctmbstr prvTidygetNextInstalledLanguage(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  ctmbstr ptVar3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var4 = *iter;
    if (p_Var4 == (TidyIterator)0x0) {
      ptVar3 = (ctmbstr)0x0;
      p_Var4 = (TidyIterator)0x0;
    }
    else {
      uVar1 = tidyInstalledLanguageListSize();
      if ((TidyIterator)(ulong)uVar1 < p_Var4) {
        ptVar3 = (ctmbstr)0x0;
      }
      else {
        ptVar3 = tidyLanguages.languages[(long)((long)&p_Var4[-1]._opaque + 3)]->messages[0].value;
        p_Var4 = (TidyIterator)((long)&p_Var4->_opaque + 1);
      }
    }
    uVar1 = tidyInstalledLanguageListSize();
    p_Var2 = (TidyIterator)0x0;
    if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
      p_Var2 = p_Var4;
    }
    *iter = p_Var2;
    return ptVar3;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/language.c"
                ,0x285,"ctmbstr prvTidygetNextInstalledLanguage(TidyIterator *)");
}

Assistant:

ctmbstr TY_(getNextInstalledLanguage)( TidyIterator* iter )
{
    ctmbstr item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyInstalledLanguageListSize() )
    {
        item = tidyLanguages.languages[itemIndex - 1]->messages[0].value;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyInstalledLanguageListSize() ? itemIndex : (size_t)0 );
    return item;
}